

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O3

bool __thiscall
chrono::ChArchiveExplorer::FetchValue<myEmployeeBoss,myEmployee>
          (ChArchiveExplorer *this,myEmployee *val,myEmployeeBoss *root,string *property_name)

{
  char *__s1;
  double dVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  myEmployee *pmVar5;
  undefined4 extraout_var_00;
  ChNameValue<myEmployeeBoss> local_30;
  
  PrepareSearch(this,property_name);
  local_30._name = "";
  local_30._flags = '\0';
  local_30._value = root;
  ChArchiveOut::out<myEmployeeBoss>(&this->super_ChArchiveOut,&local_30);
  if (this->found == true) {
    iVar4 = (*(*(this->results).
                super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>._M_impl.
                super__Vector_impl_data._M_start)->_vptr_ChValue[6])();
    __s1 = *(char **)(CONCAT44(extraout_var,iVar4) + 8);
    if (__s1 == "10myEmployee") {
LAB_0011ec80:
      iVar4 = (*(*(this->results).
                  super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>._M_impl.
                  super__Vector_impl_data._M_start)->_vptr_ChValue[0xc])();
      pmVar5 = (myEmployee *)CONCAT44(extraout_var_00,iVar4);
    }
    else {
      if (*__s1 != '*') {
        iVar4 = strcmp(__s1,"10myEmployee");
        if (iVar4 == 0) goto LAB_0011ec80;
      }
      pmVar5 = ChValue::PointerUpCast<myEmployee>
                         (*(this->results).
                           super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>
                           ._M_impl.super__Vector_impl_data._M_start);
      if (pmVar5 == (myEmployee *)0x0) goto LAB_0011ec7c;
    }
    val->body = pmVar5->body;
    uVar2 = *(undefined4 *)&pmVar5->field_0xc;
    dVar1 = pmVar5->wages;
    val->age = pmVar5->age;
    *(undefined4 *)&val->field_0xc = uVar2;
    val->wages = dVar1;
    std::__cxx11::string::_M_assign((string *)&val->name);
    bVar3 = true;
  }
  else {
LAB_0011ec7c:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool FetchValue(P& val, const T& root, const std::string& property_name) {

          this->PrepareSearch(property_name);
          
          this->operator<<( CHNVP(root,"") ); // SCAN! 

          if (found) {
              if (*this->results[0]->GetTypeid() == typeid(P)) { 
                  val = *(static_cast<P*> (this->results[0]->GetRawPtr()));
                  return true;
              }
              else if (P* valptr = this->results[0]->PointerUpCast<P>()) {
                  val = *valptr;
                  return true;
              } else
                  return false;
          }
          else
              return false;
      }